

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O2

ssize_t __thiscall wasm::ModuleWriter::write(ModuleWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  ModuleWriter *filename;
  undefined4 in_register_00000034;
  ModuleWriter *this_00;
  undefined1 local_60 [64];
  
  if ((this->binary == true) && (*(long *)((long)__buf + 8) != 0)) {
    filename = (ModuleWriter *)local_60;
    std::__cxx11::string::string((string *)filename,(string *)__buf);
    writeBinary(this,(Module *)CONCAT44(in_register_00000034,__fd),(string *)filename);
  }
  else {
    filename = (ModuleWriter *)(local_60 + 0x20);
    this_00 = filename;
    std::__cxx11::string::string((string *)filename,(string *)__buf);
    writeText(this_00,(Module *)CONCAT44(in_register_00000034,__fd),(string *)filename);
  }
  sVar1 = std::__cxx11::string::~string((string *)filename);
  return sVar1;
}

Assistant:

void ModuleWriter::write(Module& wasm, std::string filename) {
  if (binary && filename.size() > 0) {
    writeBinary(wasm, filename);
  } else {
    writeText(wasm, filename);
  }
}